

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

void DecideOverLiteralContextModeling
               (uint8_t *input,size_t start_pos,size_t length,size_t mask,int quality,
               size_t size_hint,size_t *num_literal_contexts,uint32_t **literal_context_map)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  int iVar6;
  long lVar7;
  uint *puVar8;
  uint *puVar9;
  undefined1 *puVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined4 uVar30;
  undefined4 uVar31;
  uint32_t monogram_histo [3];
  uint32_t combined_histo [32];
  uint32_t bigram_prefix_histo [9];
  double local_7d0;
  undefined1 local_7c8 [16];
  double local_7b8;
  uint local_798 [4];
  undefined1 local_788 [16];
  long local_778;
  int local_76c;
  ulong local_768;
  size_t local_760;
  double local_758;
  ulong local_750;
  uint8_t *local_748;
  size_t local_740;
  uint local_738 [32];
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined4 local_698;
  
  if (length < 0x40 || quality < 5) {
    return;
  }
  uVar11 = length + start_pos;
  local_76c = quality;
  if (size_hint < 0x100000) {
    uVar17 = start_pos + 0x40;
  }
  else {
    local_738[0x1c] = 0;
    local_738[0x1d] = 0;
    local_738[0x1e] = 0;
    local_738[0x1f] = 0;
    local_738[0x18] = 0;
    local_738[0x19] = 0;
    local_738[0x1a] = 0;
    local_738[0x1b] = 0;
    local_738[0x14] = 0;
    local_738[0x15] = 0;
    local_738[0x16] = 0;
    local_738[0x17] = 0;
    local_738[0x10] = 0;
    local_738[0x11] = 0;
    local_738[0x12] = 0;
    local_738[0x13] = 0;
    local_738[0xc] = 0;
    local_738[0xd] = 0;
    local_738[0xe] = 0;
    local_738[0xf] = 0;
    local_738[8] = 0;
    local_738[9] = 0;
    local_738[10] = 0;
    local_738[0xb] = 0;
    local_738[4] = 0;
    local_738[5] = 0;
    local_738[6] = 0;
    local_738[7] = 0;
    local_738[0] = 0;
    local_738[1] = 0;
    local_738[2] = 0;
    local_738[3] = 0;
    uVar12 = 0;
    memset(&local_6b8,0,0x680);
    local_760 = start_pos;
    uVar17 = start_pos + 0x40;
    local_7c8 = ZEXT816(0);
    local_758 = 0.0;
    local_750 = uVar11;
    local_768 = uVar17;
    if (uVar17 <= uVar11) {
      do {
        if (start_pos + 2 < uVar17) {
          lVar7 = 2;
          bVar3 = input[start_pos + 1 & mask];
          bVar4 = input[start_pos & mask];
          do {
            bVar2 = bVar3;
            bVar3 = input[start_pos + lVar7 & mask];
            bVar4 = ShouldUseComplexStaticContextMap_kStaticContextMapComplexUTF8
                    [(ulong)(""[(ulong)bVar4 + 0x500] | ""[(ulong)bVar2 + 0x400]) * 4];
            uVar14 = (ulong)(bVar3 >> 3);
            local_738[uVar14] = local_738[uVar14] + 1;
            piVar1 = (int *)((long)&local_6b8 + uVar14 * 4 + (ulong)bVar4 * 0x80);
            *piVar1 = *piVar1 + 1;
            lVar7 = lVar7 + 1;
            bVar4 = bVar2;
          } while (lVar7 != 0x40);
          uVar12 = uVar12 + 0x3e;
        }
        start_pos = start_pos + 0x1000;
        uVar17 = uVar17 + 0x1000;
      } while (uVar17 <= uVar11);
      local_758 = (double)uVar12;
    }
    local_748 = input;
    local_740 = mask;
    uVar11 = 0xfffffffffffffff8;
    uVar17 = 0;
    do {
      uVar14 = (ulong)*(uint *)((long)local_738 + uVar11 + 8);
      if (uVar14 < 0x100) {
        dVar22 = (double)kLog2Table[uVar14];
      }
      else {
        dVar22 = log2((double)uVar14);
      }
      uVar18 = (ulong)*(uint *)((long)local_738 + uVar11 + 0xc);
      if (uVar18 < 0x100) {
        dVar20 = (double)kLog2Table[uVar18];
      }
      else {
        dVar20 = log2((double)uVar18);
      }
      uVar30 = local_7c8._8_4_;
      uVar31 = local_7c8._12_4_;
      uVar17 = uVar17 + uVar14 + uVar18;
      local_7c8._0_8_ = (local_7c8._0_8_ - (double)uVar14 * dVar22) - (double)uVar18 * dVar20;
      local_7c8._8_4_ = uVar30;
      local_7c8._12_4_ = uVar31;
      uVar11 = uVar11 + 8;
    } while (uVar11 < 0x78);
    if (uVar17 != 0) {
      auVar24._8_4_ = (int)(uVar17 >> 0x20);
      auVar24._0_8_ = uVar17;
      auVar24._12_4_ = 0x45300000;
      dVar22 = (auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0);
      if (uVar17 < 0x100) {
        dVar20 = (double)kLog2Table[uVar17];
      }
      else {
        dVar20 = log2(dVar22);
      }
      local_7c8._0_8_ = (double)local_7c8._0_8_ + dVar22 * dVar20;
    }
    dVar22 = 0.0;
    lVar7 = (long)&local_6b8 + 4;
    lVar13 = 0;
    do {
      local_778 = lVar13;
      uVar11 = 0xfffffffffffffff8;
      dVar20 = 0.0;
      uVar17 = 0;
      do {
        uVar14 = (ulong)*(uint *)(lVar7 + 4 + uVar11);
        if (uVar14 < 0x100) {
          dVar21 = (double)kLog2Table[uVar14];
        }
        else {
          dVar21 = log2((double)uVar14);
        }
        uVar18 = (ulong)*(uint *)(lVar7 + 8 + uVar11);
        dVar23 = (double)uVar18;
        if (uVar18 < 0x100) {
          dVar19 = (double)kLog2Table[uVar18];
        }
        else {
          local_788._0_8_ = dVar23;
          dVar19 = log2(dVar23);
          dVar23 = (double)local_788._0_8_;
        }
        input = local_748;
        uVar17 = uVar17 + uVar14 + uVar18;
        dVar20 = (dVar20 - (double)uVar14 * dVar21) - dVar23 * dVar19;
        uVar11 = uVar11 + 8;
      } while (uVar11 < 0x78);
      if (uVar17 != 0) {
        auVar25._8_4_ = (int)(uVar17 >> 0x20);
        auVar25._0_8_ = uVar17;
        auVar25._12_4_ = 0x45300000;
        dVar21 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0);
        if (uVar17 < 0x100) {
          dVar23 = (double)kLog2Table[uVar17];
        }
        else {
          dVar23 = log2(dVar21);
        }
        dVar20 = dVar20 + dVar21 * dVar23;
      }
      dVar22 = dVar22 + dVar20;
      lVar13 = local_778 + 1;
      lVar7 = lVar7 + 0x80;
    } while (lVar13 != 0xd);
    dVar22 = dVar22 * (1.0 / local_758);
    uVar11 = local_750;
    start_pos = local_760;
    uVar17 = local_768;
    mask = local_740;
    if ((dVar22 <= 3.0) && (0.2 <= (1.0 / local_758) * (double)local_7c8._0_8_ - dVar22)) {
      *num_literal_contexts = 0xd;
      puVar10 = ShouldUseComplexStaticContextMap_kStaticContextMapComplexUTF8;
      goto LAB_00109dbb;
    }
  }
  local_6a8 = 0;
  uStack_6a0 = 0;
  local_6b8 = 0;
  uStack_6b0 = 0;
  local_698 = 0;
  if (uVar17 <= uVar11) {
    lVar7 = uVar17 - start_pos;
    do {
      if (start_pos + 1 < uVar17) {
        iVar16 = DecideOverLiteralContextModeling::lut[input[start_pos & mask] >> 6];
        lVar13 = 1;
        do {
          iVar6 = iVar16 * 3;
          iVar16 = DecideOverLiteralContextModeling::lut[input[start_pos + lVar13 & mask] >> 6];
          piVar1 = (int *)((long)&local_6b8 + (long)(iVar6 + iVar16) * 4);
          *piVar1 = *piVar1 + 1;
          lVar13 = lVar13 + 1;
        } while (lVar7 != lVar13);
      }
      start_pos = start_pos + 0x1000;
      uVar17 = uVar17 + 0x1000;
    } while (uVar17 <= uVar11);
  }
  puVar9 = local_798 + 1;
  uVar11 = 0;
  local_798[0] = 0;
  local_798[1] = 0;
  local_798[2] = 0;
  local_738[4] = 0;
  local_738[5] = 0;
  local_738[0] = 0;
  local_738[1] = 0;
  local_738[2] = 0;
  local_738[3] = 0;
  do {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar11;
    iVar16 = *(int *)((long)&local_6b8 + uVar11 * 4);
    piVar1 = (int *)((long)local_798 +
                    uVar11 * 4 +
                    (SUB168(auVar5 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU) * -3)
    ;
    *piVar1 = *piVar1 + iVar16;
    uVar17 = uVar11;
    if (5 < uVar11) {
      uVar17 = uVar11 - 6;
    }
    local_738[uVar17] = local_738[uVar17] + iVar16;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 9);
  bVar15 = true;
  puVar8 = local_798;
  dVar22 = 0.0;
  uVar30 = 0;
  uVar31 = 0;
  lVar7 = 0;
  while( true ) {
    uVar11 = (ulong)*puVar8;
    if (uVar11 < 0x100) {
      dVar20 = (double)kLog2Table[uVar11];
    }
    else {
      local_788._8_4_ = uVar30;
      local_788._0_8_ = dVar22;
      local_788._12_4_ = uVar31;
      dVar20 = log2((double)uVar11);
      dVar22 = local_788._0_8_;
      uVar30 = local_788._8_4_;
      uVar31 = local_788._12_4_;
    }
    uVar17 = lVar7 + uVar11;
    dVar22 = dVar22 - (double)uVar11 * dVar20;
    if (!bVar15) break;
    uVar11 = (ulong)*puVar9;
    if (uVar11 < 0x100) {
      dVar20 = (double)kLog2Table[uVar11];
    }
    else {
      local_788._8_4_ = uVar30;
      local_788._0_8_ = dVar22;
      local_788._12_4_ = uVar31;
      dVar20 = log2((double)uVar11);
      dVar22 = local_788._0_8_;
      uVar30 = local_788._8_4_;
      uVar31 = local_788._12_4_;
    }
    lVar7 = uVar17 + uVar11;
    dVar22 = dVar22 - (double)uVar11 * dVar20;
    bVar15 = false;
    puVar8 = local_798 + 2;
    puVar9 = local_798 + 3;
  }
  if (uVar17 != 0) {
    auVar26._8_4_ = (int)(uVar17 >> 0x20);
    auVar26._0_8_ = uVar17;
    auVar26._12_4_ = 0x45300000;
    dVar20 = (auVar26._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0);
    if (uVar17 < 0x100) {
      dVar21 = (double)kLog2Table[uVar17];
    }
    else {
      local_788._8_4_ = uVar30;
      local_788._0_8_ = dVar22;
      local_788._12_4_ = uVar31;
      dVar21 = log2(dVar20);
      dVar22 = local_788._0_8_;
      uVar30 = local_788._8_4_;
      uVar31 = local_788._12_4_;
    }
    dVar22 = dVar22 + dVar20 * dVar21;
  }
  local_788._8_4_ = uVar30;
  local_788._0_8_ = dVar22;
  local_788._12_4_ = uVar31;
  bVar15 = true;
  local_7b8 = 0.0;
  lVar7 = 0;
  puVar9 = local_738;
  puVar8 = local_738 + 1;
  while( true ) {
    uVar11 = (ulong)*puVar9;
    if (uVar11 < 0x100) {
      dVar22 = (double)kLog2Table[uVar11];
    }
    else {
      dVar22 = log2((double)uVar11);
    }
    uVar17 = lVar7 + uVar11;
    local_7b8 = local_7b8 - (double)uVar11 * dVar22;
    if (!bVar15) break;
    uVar11 = (ulong)*puVar8;
    if (uVar11 < 0x100) {
      dVar22 = (double)kLog2Table[uVar11];
    }
    else {
      dVar22 = log2((double)uVar11);
    }
    lVar7 = uVar17 + uVar11;
    local_7b8 = local_7b8 - (double)uVar11 * dVar22;
    bVar15 = false;
    puVar9 = local_738 + 2;
    puVar8 = local_738 + 3;
  }
  if (uVar17 != 0) {
    auVar27._8_4_ = (int)(uVar17 >> 0x20);
    auVar27._0_8_ = uVar17;
    auVar27._12_4_ = 0x45300000;
    dVar22 = (auVar27._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0);
    if (uVar17 < 0x100) {
      dVar20 = (double)kLog2Table[uVar17];
    }
    else {
      dVar20 = log2(dVar22);
    }
    local_7b8 = local_7b8 + dVar22 * dVar20;
  }
  uVar11 = 0xc;
  dVar22 = 0.0;
  lVar7 = 0;
  while( true ) {
    uVar17 = (ulong)*(uint *)((long)local_738 + uVar11);
    if (uVar17 < 0x100) {
      dVar20 = (double)kLog2Table[uVar17];
    }
    else {
      dVar20 = log2((double)uVar17);
    }
    uVar14 = lVar7 + uVar17;
    dVar22 = dVar22 - (double)uVar17 * dVar20;
    if (0x13 < uVar11) break;
    uVar17 = (ulong)*(uint *)((long)local_738 + uVar11 + 4);
    if (uVar17 < 0x100) {
      dVar20 = (double)kLog2Table[uVar17];
    }
    else {
      dVar20 = log2((double)uVar17);
    }
    lVar7 = uVar14 + uVar17;
    dVar22 = dVar22 - (double)uVar17 * dVar20;
    uVar11 = uVar11 + 8;
  }
  if (uVar14 != 0) {
    auVar28._8_4_ = (int)(uVar14 >> 0x20);
    auVar28._0_8_ = uVar14;
    auVar28._12_4_ = 0x45300000;
    dVar20 = (auVar28._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0);
    if (uVar14 < 0x100) {
      dVar21 = (double)kLog2Table[uVar14];
    }
    else {
      dVar21 = log2(dVar20);
    }
    dVar22 = dVar22 + dVar20 * dVar21;
  }
  local_7d0 = 0.0;
  lVar7 = 0;
  do {
    bVar15 = true;
    lVar13 = 0;
    dVar20 = 0.0;
    uVar11 = 0;
    while( true ) {
      uVar17 = (ulong)*(uint *)((long)&local_6b8 + uVar11 + lVar7 * 0xc);
      if (uVar17 < 0x100) {
        dVar21 = (double)kLog2Table[uVar17];
      }
      else {
        dVar21 = log2((double)uVar17);
      }
      uVar14 = lVar13 + uVar17;
      dVar20 = dVar20 - (double)uVar17 * dVar21;
      if (!bVar15) break;
      uVar11 = (ulong)*(uint *)((long)&local_6b8 + (uVar11 | 4) + lVar7 * 0xc);
      if (uVar11 < 0x100) {
        dVar21 = (double)kLog2Table[uVar11];
      }
      else {
        dVar21 = log2((double)uVar11);
      }
      lVar13 = uVar14 + uVar11;
      dVar20 = dVar20 - (double)uVar11 * dVar21;
      uVar11 = 8;
      bVar15 = false;
    }
    if (uVar14 != 0) {
      auVar29._8_4_ = (int)(uVar14 >> 0x20);
      auVar29._0_8_ = uVar14;
      auVar29._12_4_ = 0x45300000;
      dVar21 = (auVar29._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0);
      if (uVar14 < 0x100) {
        dVar23 = (double)kLog2Table[uVar14];
      }
      else {
        dVar23 = log2(dVar21);
      }
      dVar20 = dVar20 + dVar21 * dVar23;
    }
    local_7d0 = local_7d0 + dVar20;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar21 = 1.0 / (double)(local_798[1] + local_798[0] + local_798[2]);
  dVar20 = (double)local_788._0_8_ * dVar21;
  dVar22 = (local_7b8 + dVar22) * dVar21;
  if (local_76c < 7) {
    local_7d0 = dVar20 * 10.0;
  }
  else {
    local_7d0 = local_7d0 * dVar21;
  }
  if ((dVar20 - dVar22 < 0.2) && (dVar20 - local_7d0 < 0.2)) {
    *num_literal_contexts = 1;
    return;
  }
  if (0.02 <= dVar22 - local_7d0) {
    *num_literal_contexts = 3;
    puVar10 = ChooseContextMap_kStaticContextMapContinuation;
  }
  else {
    *num_literal_contexts = 2;
    puVar10 = ChooseContextMap_kStaticContextMapSimpleUTF8;
  }
LAB_00109dbb:
  *literal_context_map = (uint32_t *)puVar10;
  return;
}

Assistant:

static void DecideOverLiteralContextModeling(const uint8_t* input,
    size_t start_pos, size_t length, size_t mask, int quality, size_t size_hint,
    size_t* num_literal_contexts, const uint32_t** literal_context_map) {
  if (quality < MIN_QUALITY_FOR_CONTEXT_MODELING || length < 64) {
    return;
  } else if (ShouldUseComplexStaticContextMap(
      input, start_pos, length, mask, quality, size_hint,
      num_literal_contexts, literal_context_map)) {
    /* Context map was already set, nothing else to do. */
  } else {
    /* Gather bi-gram data of the UTF8 byte prefixes. To make the analysis of
       UTF8 data faster we only examine 64 byte long strides at every 4kB
       intervals. */
    const size_t end_pos = start_pos + length;
    uint32_t bigram_prefix_histo[9] = { 0 };
    for (; start_pos + 64 <= end_pos; start_pos += 4096) {
      static const int lut[4] = { 0, 0, 1, 2 };
      const size_t stride_end_pos = start_pos + 64;
      int prev = lut[input[start_pos & mask] >> 6] * 3;
      size_t pos;
      for (pos = start_pos + 1; pos < stride_end_pos; ++pos) {
        const uint8_t literal = input[pos & mask];
        ++bigram_prefix_histo[prev + lut[literal >> 6]];
        prev = lut[literal >> 6] * 3;
      }
    }
    ChooseContextMap(quality, &bigram_prefix_histo[0], num_literal_contexts,
                     literal_context_map);
  }
}